

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O0

void __thiscall cppforth::Forth::replaces(Forth *this)

{
  bool bVar1;
  undefined1 uVar2;
  uint uVar3;
  uint src;
  size_type sVar4;
  mapped_type *this_00;
  ForthStack<unsigned_int> *this_01;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_e8;
  _Self local_a8;
  undefined4 local_9c;
  iterator iStack_98;
  int a;
  iterator itfound;
  char *c;
  iterator __end2;
  iterator __begin2;
  string *__range2;
  string Word2;
  undefined1 local_40 [8];
  string Word1;
  CAddr caddr1;
  uint length1;
  CAddr caddr2;
  uint length2;
  Forth *this_local;
  
  requireDStackDepth(this,4,"REPLACES");
  this_01 = &this->dStack;
  uVar3 = ForthStack<unsigned_int>::getTop(this_01);
  pop(this);
  src = ForthStack<unsigned_int>::getTop(this_01);
  pop(this);
  Word1.field_2._12_4_ = ForthStack<unsigned_int>::getTop(this_01);
  pop(this);
  Word1.field_2._8_4_ = ForthStack<unsigned_int>::getTop(this_01);
  pop(this);
  std::__cxx11::string::string((string *)local_40);
  moveFromDataSpace(this,(string *)local_40,Word1.field_2._8_4_,(ulong)(uint)Word1.field_2._12_4_);
  std::__cxx11::string::string((string *)&__range2);
  moveFromDataSpace(this,(string *)&__range2,src,(ulong)uVar3);
  __end2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::begin
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__range2
                     );
  c = (char *)std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::end
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &__range2);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      (&__end2,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)&c);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    itfound._M_node =
         (_Base_ptr)
         __gnu_cxx::
         __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         ::operator*(&__end2);
    uVar2 = toupper_ascii((char)(itfound._M_node)->_M_color);
    *(undefined1 *)&(itfound._M_node)->_M_color = uVar2;
    __gnu_cxx::
    __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&__end2);
  }
  iStack_98 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::find(&this->replacesSubstitute,(key_type *)local_40);
  sVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__range2)
  ;
  if (sVar4 == 0) {
    local_9c = 2;
  }
  local_a8._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::end(&this->replacesSubstitute);
  bVar1 = std::operator==(&stack0xffffffffffffff68,&local_a8);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    this_00 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&this->replacesSubstitute,(key_type *)&__range2);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (this_00,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40
              );
  }
  else {
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
              (&local_e8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__range2,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40);
    std::
    map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
    ::insert<std::pair<std::__cxx11::string,std::__cxx11::string>>
              ((map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                *)&this->replacesSubstitute,&local_e8);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair(&local_e8);
  }
  std::__cxx11::string::~string((string *)&__range2);
  std::__cxx11::string::~string((string *)local_40);
  return;
}

Assistant:

void replaces(){
			REQUIRE_DSTACK_DEPTH(4, "REPLACES");
			auto length2 = dStack.getTop(); pop();
			auto caddr2 = CADDR(dStack.getTop()); pop();
			auto length1 = dStack.getTop(); pop();
			auto caddr1 = CADDR(dStack.getTop());pop(); 
			std::string Word1{};
			moveFromDataSpace(Word1, caddr1, length1);
			std::string Word2{};
			moveFromDataSpace(Word2, caddr2, length2);
			for(auto &c : Word2) c=toupper_ascii(c);
			auto itfound=replacesSubstitute.find(Word1);
			if(Word2.size()==0){
				int a=1;
				a=a+1;
			}
			if(itfound!=replacesSubstitute.end()){
				replacesSubstitute.insert(std::pair<std::string,std::string>(Word2,Word1));
			} else {
				replacesSubstitute[Word2]=Word1;
			}
			//dStack.setTop((result < 0) ? -1 : ((result > 0) ? 1 : 0)); 
		}